

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O0

void tcu::opt::registerLegacyOptions(Parser *parser)

{
  Parser *parser_00;
  Option<tcu::opt::GLConfigName> local_80;
  Option<tcu::opt::GLConfigID> local_48;
  Parser *local_10;
  Parser *parser_local;
  
  local_10 = parser;
  de::cmdline::Option<tcu::opt::GLConfigID>::Option
            (&local_48,(char *)0x0,"deqp-egl-config-id","Legacy name for --deqp-gl-config-id","-1");
  parser_00 = de::cmdline::detail::operator<<(parser,&local_48);
  de::cmdline::Option<tcu::opt::GLConfigName>::Option
            (&local_80,(char *)0x0,"deqp-egl-config-name","Legacy name for --deqp-gl-config-name",
             (char *)0x0);
  de::cmdline::detail::operator<<(parser_00,&local_80);
  return;
}

Assistant:

void registerLegacyOptions (de::cmdline::Parser& parser)
{
	using de::cmdline::Option;

	parser
		<< Option<GLConfigID>			(DE_NULL,	"deqp-egl-config-id",			"Legacy name for --deqp-gl-config-id",	"-1")
		<< Option<GLConfigName>			(DE_NULL,	"deqp-egl-config-name",			"Legacy name for --deqp-gl-config-name");
}